

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hash_table.cpp
# Opt level: O0

void __thiscall
ON_Hash32Table::Internal_AdjustTableCapacity(ON_Hash32Table *this,ON__UINT32 item_count)

{
  ON_Hash32TableItem *pOVar1;
  ON_Hash32TableItem **__s;
  uint uVar2;
  ON__UINT32 j;
  ON_Hash32TableItem *next;
  ON_Hash32TableItem *item;
  ON__UINT32 i;
  ON_Hash32TableItem **hash_table;
  size_t sizeof_hash_table;
  ON__UINT32 hash_table_capacity;
  ON__UINT32 target_list_length;
  ON__UINT32 max_capacity;
  ON__UINT32 item_count_local;
  ON_Hash32Table *this_local;
  
  if ((this->m_hash_table_capacity < 0x40000) && (this->m_hash_table_capacity <= item_count >> 3)) {
    sizeof_hash_table._0_4_ = this->m_hash_table_capacity;
    if ((uint)sizeof_hash_table < 0x40) {
      sizeof_hash_table._0_4_ = 0x40;
    }
    for (; (uint)sizeof_hash_table < 0x40000 && (uint)sizeof_hash_table < item_count >> 3;
        sizeof_hash_table._0_4_ = (uint)sizeof_hash_table << 1) {
    }
    __s = (ON_Hash32TableItem **)onmalloc((ulong)(uint)sizeof_hash_table << 3);
    memset(__s,0,(ulong)(uint)sizeof_hash_table << 3);
    if (this->m_item_count != 0) {
      for (item._4_4_ = 0; item._4_4_ < this->m_hash_table_capacity; item._4_4_ = item._4_4_ + 1) {
        next = this->m_hash_table[item._4_4_];
        while (next != (ON_Hash32TableItem *)0x0) {
          pOVar1 = next->m_internal_next;
          uVar2 = next->m_internal_hash32 % (uint)sizeof_hash_table;
          next->m_internal_next = __s[uVar2];
          __s[uVar2] = next;
          next = pOVar1;
        }
      }
      onfree(this->m_hash_table);
    }
    this->m_hash_table = __s;
    this->m_hash_table_capacity = (uint)sizeof_hash_table;
  }
  return;
}

Assistant:

void ON_Hash32Table::Internal_AdjustTableCapacity(
  ON__UINT32 item_count
  )
{
  const ON__UINT32 max_capacity = 256 * 1024;
  const ON__UINT32 target_list_length = 8;
  if (m_hash_table_capacity < max_capacity && item_count/target_list_length >= m_hash_table_capacity)
  {
    ON__UINT32 hash_table_capacity = m_hash_table_capacity;
    if (hash_table_capacity < 64)
      hash_table_capacity = 64;
    while (hash_table_capacity < max_capacity && item_count/target_list_length > hash_table_capacity)
      hash_table_capacity *= 2;

    size_t sizeof_hash_table = hash_table_capacity*sizeof(m_hash_table[0]);
    ON_Hash32TableItem** hash_table = (ON_Hash32TableItem**)onmalloc(sizeof_hash_table);
    memset(hash_table,0,sizeof_hash_table);
    if (m_item_count > 0)
    {
      for (ON__UINT32 i = 0; i < m_hash_table_capacity; i++)
      {
        ON_Hash32TableItem* item = m_hash_table[i];
        while (nullptr != item)
        {
          ON_Hash32TableItem* next = item->m_internal_next;
          const ON__UINT32 j = item->m_internal_hash32 % hash_table_capacity;
          item->m_internal_next = hash_table[j];
          hash_table[j] = item;
          item = next;
        }
      }
      onfree(m_hash_table);
    }
    m_hash_table = hash_table;
    m_hash_table_capacity = hash_table_capacity;
  }
}